

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_class(void)

{
  player_class *ppVar1;
  start_item *psVar2;
  class_book_conflict *pcVar3;
  class_spell_conflict *pcVar4;
  int local_40;
  int local_3c;
  wchar_t j;
  wchar_t i;
  class_book *book;
  class_spell *spell;
  start_item *item_next;
  start_item *item;
  player_class *next;
  player_class *c;
  
  next = classes;
  while (next != (player_class *)0x0) {
    ppVar1 = next->next;
    item_next = (start_item *)next->start_items;
    while (item_next != (start_item *)0x0) {
      psVar2 = item_next->next;
      mem_free(item_next->eopts);
      mem_free(item_next);
      item_next = psVar2;
    }
    for (local_3c = 0; local_3c < (next->magic).num_books; local_3c = local_3c + 1) {
      pcVar3 = (next->magic).books;
      for (local_40 = 0; local_40 < pcVar3[local_3c].num_spells; local_40 = local_40 + 1) {
        pcVar4 = pcVar3[local_3c].spells + local_40;
        string_free(pcVar4->name);
        string_free(pcVar4->text);
        free_effect(pcVar4->effect);
      }
      mem_free(pcVar3[local_3c].spells);
    }
    mem_free((next->magic).books);
    for (local_3c = 9; -1 < local_3c; local_3c = local_3c + -1) {
      string_free(next->title[local_3c]);
    }
    string_free(next->name);
    mem_free(next);
    next = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_class(void)
{
	struct player_class *c = classes;
	struct player_class *next;
	struct start_item *item, *item_next;
	struct class_spell *spell;
	struct class_book *book;
	int i, j;

	while (c) {
		next = c->next;
		item = c->start_items;
		while(item) {
			item_next = item->next;
			mem_free(item->eopts);
			mem_free(item);
			item = item_next;
		}
		for (i = 0; i < c->magic.num_books; i++) {
			book = &c->magic.books[i];
			for (j = 0; j < book->num_spells; j++) {
				spell = &book->spells[j];
				string_free(spell->name);
				string_free(spell->text);
				free_effect(spell->effect);
			}
			mem_free(book->spells);
		}
		mem_free(c->magic.books);
		for (i = (int) N_ELEMENTS(c->title) - 1; i >= 0; --i) {
			string_free((char *)c->title[i]);
		}
		string_free((char *)c->name);
		mem_free(c);
		c = next;
	}
}